

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O0

Bool prvTidytidySetLanguage(ctmbstr languageCode)

{
  languageDefinition *plVar1;
  size_t sVar2;
  bool local_34;
  char local_33 [2];
  undefined1 local_31;
  tmbstr ptStack_30;
  char lang [3];
  tmbstr wantCode;
  languageDefinition *dict2;
  languageDefinition *dict1;
  ctmbstr languageCode_local;
  
  wantCode = (tmbstr)0x0;
  ptStack_30 = (tmbstr)0x0;
  memset(local_33,0,3);
  if ((languageCode == (ctmbstr)0x0) ||
     (ptStack_30 = prvTidytidyNormalizedLocaleName(languageCode), ptStack_30 == (tmbstr)0x0)) {
    languageCode_local._4_4_ = no;
  }
  else {
    plVar1 = prvTidytidyTestLanguage(ptStack_30);
    sVar2 = strlen(ptStack_30);
    if (2 < sVar2) {
      strncpy(local_33,ptStack_30,2);
      local_31 = 0;
      wantCode = (tmbstr)prvTidytidyTestLanguage(local_33);
    }
    if ((plVar1 != (languageDefinition *)0x0) && (wantCode != (tmbstr)0x0)) {
      tidyLanguages.fallbackLanguage = (languageDefinition *)wantCode;
      tidyLanguages.currentLanguage = plVar1;
    }
    if ((plVar1 != (languageDefinition *)0x0) && (wantCode == (tmbstr)0x0)) {
      tidyLanguages.fallbackLanguage = (languageDefinition *)0x0;
      tidyLanguages.currentLanguage = plVar1;
    }
    if ((plVar1 == (languageDefinition *)0x0) && (wantCode != (tmbstr)0x0)) {
      tidyLanguages.currentLanguage = (languageDefinition *)wantCode;
      tidyLanguages.fallbackLanguage = (languageDefinition *)0x0;
    }
    local_34 = plVar1 != (languageDefinition *)0x0 || wantCode != (tmbstr)0x0;
    languageCode_local._4_4_ = (Bool)local_34;
  }
  return languageCode_local._4_4_;
}

Assistant:

TY_PRIVATE Bool TY_(tidySetLanguage)( ctmbstr languageCode )
{
    languageDefinition *dict1 = NULL;
    languageDefinition *dict2 = NULL;
    tmbstr wantCode = NULL;
    char lang[3] = "";
    
    if ( !languageCode || !(wantCode = TY_(tidyNormalizedLocaleName)( languageCode )) )
    {
        return no;
    }
    
    /* We want to use the specified language as the currentLanguage, and set
     fallback language as necessary. We have either a two or five digit code,
     either or both of which might be installed. Let's test both of them:
     */
    
    dict1 = TY_(tidyTestLanguage( wantCode ));  /* WANTED language */
    
    if ( strlen( wantCode ) > 2 )
    {
        strncpy(lang, wantCode, 2);
        lang[2] = '\0';
        dict2 = TY_(tidyTestLanguage( lang ) ); /* BACKUP language? */
    }
    
    if ( dict1 && dict2 )
    {
        tidyLanguages.currentLanguage = dict1;
        tidyLanguages.fallbackLanguage = dict2;
    }
    if ( dict1 && !dict2 )
    {
        tidyLanguages.currentLanguage = dict1;
        tidyLanguages.fallbackLanguage = NULL;
    }
    if ( !dict1 && dict2 )
    {
        tidyLanguages.currentLanguage = dict2;
        tidyLanguages.fallbackLanguage = NULL;
    }
    if ( !dict1 && !dict2 )
    {
        /* No change. */
    }
    
    return dict1 || dict2;
}